

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::EventName::EventName(EventName *this)

{
  EventName *this_local;
  
  protozero::CppMessageObj::CppMessageObj(&this->super_CppMessageObj);
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__EventName_009c23a8;
  this->iid_ = 0;
  ::std::__cxx11::string::string((string *)&this->name_);
  ::std::__cxx11::string::string((string *)&this->unknown_fields_);
  std::bitset<3UL>::bitset(&this->_has_field_);
  return;
}

Assistant:

EventName::EventName() = default;